

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O0

void am_translate_coord_to_me(Am_Object *in_obj,Am_Object *ref_obj,int *x,int *y)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object owner;
  int *y_local;
  int *x_local;
  Am_Object *ref_obj_local;
  Am_Object *in_obj_local;
  
  owner.data = (Am_Object_Data *)y;
  bVar1 = Am_Object::operator==(ref_obj,in_obj);
  if (!bVar1) {
    Am_Object::Am_Object(&local_30);
    Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)in_obj);
    Am_Object::operator=(&local_30,&local_38);
    Am_Object::~Am_Object(&local_38);
    bVar1 = Am_Object::Valid(&local_30);
    if ((bVar1) && (bVar1 = Am_Object::operator==(&local_30,ref_obj), bVar1)) {
      pAVar3 = Am_Object::Get(in_obj,100,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      *x = *x - iVar2;
      pAVar3 = Am_Object::Get(in_obj,0x65,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      *(int *)&((owner.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
           *(int *)&((owner.data)->super_Am_Wrapper).super_Am_Registered_Type.
                    _vptr_Am_Registered_Type - iVar2;
    }
    else {
      Am_Translate_Coordinates
                (ref_obj,*x,
                 *(int *)&((owner.data)->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type,in_obj,x,(int *)owner.data);
    }
    Am_Object::~Am_Object(&local_30);
  }
  return;
}

Assistant:

void
am_translate_coord_to_me(Am_Object in_obj, Am_Object ref_obj, int &x, int &y)
{
  if (ref_obj == in_obj) {
    return; //x, y are already OK
  } else {
    Am_Object owner;
    owner = in_obj.Get_Owner();
    if (owner.Valid() && owner == ref_obj) { // cheap transformation
      x -= (int)in_obj.Get(Am_LEFT); //simple translate coords to the inside
      y -= (int)in_obj.Get(Am_TOP);  // of object
    } else //not the owner, use expensive transformation
      Am_Translate_Coordinates(ref_obj, x, y, in_obj, x, y);
  }
}